

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cpp
# Opt level: O1

vector<UniValue,_std::allocator<UniValue>_> * __thiscall
ArgsManager::GetSettingsList
          (vector<UniValue,_std::allocator<UniValue>_> *__return_storage_ptr__,ArgsManager *this,
          string *arg)

{
  bool bVar1;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock24;
  unique_lock<std::recursive_mutex> local_50;
  string local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_50._M_owns = false;
  local_50._M_device = (mutex_type *)this;
  std::unique_lock<std::recursive_mutex>::lock(&local_50);
  SettingName(&local_40,arg);
  bVar1 = UseDefaultSection(this,arg);
  common::GetSettingsList
            (__return_storage_ptr__,&this->m_settings,&this->m_network,&local_40,!bVar1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::vector<common::SettingsValue> ArgsManager::GetSettingsList(const std::string& arg) const
{
    LOCK(cs_args);
    return common::GetSettingsList(m_settings, m_network, SettingName(arg), !UseDefaultSection(arg));
}